

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime.c
# Opt level: O2

int week_calc(tm *timeptr,int wtype)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  div_t dVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  if (wtype < 2) {
    dVar4 = div(timeptr->tm_yday,7);
    return (uint)(((timeptr->tm_wday - wtype) + 7) % 7 <= dVar4.rem) + dVar4.quot;
  }
  iVar2 = timeptr->tm_wday;
  iVar7 = timeptr->tm_yday;
  iVar1 = iVar2;
  if (iVar2 == 0) {
    iVar1 = 7;
  }
  iVar6 = iVar7 - iVar1;
  if ((iVar7 - iVar1) - 0x168U < 7) {
    iVar2 = _PDCLIB_is_leap(timeptr->tm_year);
    uVar3 = 0x35;
    if (0x168 < iVar6 - iVar2) {
      uVar3 = 1;
    }
LAB_0010a26c:
    if (wtype == 2) {
      return uVar3;
    }
    if ((int)uVar3 < 0x34) {
      uVar5 = 0;
      if (uVar3 == 1) {
        uVar5 = (uint)(timeptr->tm_mon == 0xb);
      }
      goto LAB_0010a290;
    }
  }
  else {
    uVar3 = (iVar6 + 0xb) / 7;
    if (0xc < iVar6 + 0x11U) goto LAB_0010a26c;
    iVar2 = iVar2 - iVar7 % 7;
    iVar7 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar7 = iVar2;
    }
    if (iVar7 != 5) {
      iVar2 = _PDCLIB_is_leap(timeptr->tm_year + -1);
      uVar3 = (iVar7 == 6 && iVar2 != 0) | 0x34;
      goto LAB_0010a26c;
    }
    if (wtype == 2) {
      return 0x35;
    }
  }
  uVar5 = -(uint)(timeptr->tm_mon == 0);
LAB_0010a290:
  return timeptr->tm_year + uVar5 + 0x76c;
}

Assistant:

static int week_calc( const struct tm * timeptr, int wtype )
{
    int wday;
    int bias;
    int week;

    if ( wtype <= E_MONDAY )
    {
        /* Simple -- first week starting with E_SUNDAY / E_MONDAY,
           days before that are week 0.
        */
        div_t weeks = div( timeptr->tm_yday, 7 );
        wday = ( timeptr->tm_wday + 7 - wtype ) % 7;

        if ( weeks.rem >= wday )
        {
            ++weeks.quot;
        }

        return weeks.quot;
    }

    /* calculating ISO week; relies on Sunday == 7 */
    wday = timeptr->tm_wday;

    if ( wday == 0 )
    {
        wday = 7;
    }

    /* https://en.wikipedia.org/wiki/ISO_week_date */
    week = ( timeptr->tm_yday - wday + 11 ) / 7;

    if ( week == 53 )
    {
        /* date *may* belong to the *next* year, if:
           * it is 31.12. and Monday - Wednesday
           * it is 30.12. and Monday - Tuesday
           * it is 29.12. and Monday
           We can safely assume December...
        */
        if ( ( timeptr->tm_yday - wday - _PDCLIB_is_leap( timeptr->tm_year ) ) > 360 )
        {
            week = 1;
        }
    }
    else if ( week == 0 )
    {
        /* date *does* belong to *previous* year,
           i.e. has week 52 *unless*...
           * current year started on a Friday, or
           * previous year is leap and this year
             started on a Saturday.
        */
        int firstday = timeptr->tm_wday - ( timeptr->tm_yday % 7 );

        if ( firstday < 0 )
        {
            firstday += 7;
        }

        if ( ( firstday == 5 ) || ( _PDCLIB_is_leap( timeptr->tm_year - 1 ) && firstday == 6 ) )
        {
            week = 53;
        }
        else
        {
            week = 52;
        }
    }

    if ( wtype == E_ISO_WEEK )
    {
        return week;
    }

    /* E_ISO_YEAR -- determine the "week-based year" */
    bias = 0;

    if ( week >= 52 && timeptr->tm_mon == 0 )
    {
        --bias;
    }
    else if ( week == 1 && timeptr->tm_mon == 11 )
    {
        ++bias;
    }

    return timeptr->tm_year + 1900 + bias;
}